

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Token>::emplaceRealloc<slang::parsing::Token_const&>
          (SmallVectorBase<slang::parsing::Token> *this,pointer pos,Token *args)

{
  ulong uVar1;
  pointer p;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  pointer pTVar6;
  pointer pTVar7;
  pointer pTVar8;
  long lVar9;
  long lVar10;
  size_type sVar11;
  ulong uVar12;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar1 = this->cap;
  if (uVar12 < uVar1 * 2) {
    uVar12 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar12 = 0x7ffffffffffffff;
  }
  lVar10 = (long)pos - (long)this->data_;
  pTVar6 = (pointer)operator_new(uVar12 << 4);
  pIVar2 = args->info;
  *(undefined8 *)((long)pTVar6 + lVar10) = *(undefined8 *)args;
  ((undefined8 *)((long)pTVar6 + lVar10))[1] = pIVar2;
  p = this->data_;
  sVar11 = this->len;
  lVar9 = (long)p + (sVar11 * 0x10 - (long)pos);
  pTVar7 = p;
  pTVar8 = pTVar6;
  if (lVar9 == 0) {
    pTVar7 = pTVar6;
    pTVar8 = p;
    if (sVar11 != 0) {
      do {
        uVar3 = pTVar8->field_0x2;
        NVar4.raw = (pTVar8->numFlags).raw;
        uVar5 = pTVar8->rawLen;
        pIVar2 = pTVar8->info;
        pTVar7->kind = pTVar8->kind;
        pTVar7->field_0x2 = uVar3;
        pTVar7->numFlags = (NumericTokenFlags)NVar4.raw;
        pTVar7->rawLen = uVar5;
        pTVar7->info = pIVar2;
        pTVar8 = pTVar8 + 1;
        pTVar7 = pTVar7 + 1;
      } while (pTVar8 != pos);
    }
  }
  else {
    for (; pTVar7 != pos; pTVar7 = pTVar7 + 1) {
      uVar3 = pTVar7->field_0x2;
      NVar4.raw = (pTVar7->numFlags).raw;
      uVar5 = pTVar7->rawLen;
      pIVar2 = pTVar7->info;
      pTVar8->kind = pTVar7->kind;
      pTVar8->field_0x2 = uVar3;
      pTVar8->numFlags = (NumericTokenFlags)NVar4.raw;
      pTVar8->rawLen = uVar5;
      pTVar8->info = pIVar2;
      pTVar8 = pTVar8 + 1;
    }
    memcpy((void *)((long)pTVar6 + lVar10 + 0x10),pos,(lVar9 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar11 = this->len;
  }
  this->len = sVar11 + 1;
  this->cap = uVar12;
  this->data_ = pTVar6;
  return (pointer)((long)pTVar6 + lVar10);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}